

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O2

void * times_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *owner;
  t_float tVar1;
  
  if (argc < 2) {
    if (argc == 0) {
      owner = (t_object *)pd_new(times_class);
      inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
      goto LAB_00116a4d;
    }
  }
  else {
    post("*~: extra arguments ignored");
  }
  owner = (t_object *)pd_new(scalartimes_class);
  floatinlet_new(owner,(t_float *)((long)&owner[1].te_g.g_pd + 4));
  tVar1 = atom_getfloatarg(0,argc,argv);
  *(t_float *)((long)&owner[1].te_g.g_pd + 4) = tVar1;
LAB_00116a4d:
  outlet_new(owner,&s_signal);
  *(undefined4 *)&owner[1].te_g.g_pd = 0;
  return owner;
}

Assistant:

static void *times_new(t_symbol *s, int argc, t_atom *argv)
{
    if (argc > 1) post("*~: extra arguments ignored");
    if (argc)
    {
        t_scalartimes *x = (t_scalartimes *)pd_new(scalartimes_class);
        floatinlet_new(&x->x_obj, &x->x_g);
        x->x_g = atom_getfloatarg(0, argc, argv);
        outlet_new(&x->x_obj, &s_signal);
        x->x_f = 0;
        return (x);
    }
    else
    {
        t_times *x = (t_times *)pd_new(times_class);
        inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
        outlet_new(&x->x_obj, &s_signal);
        x->x_f = 0;
        return (x);
    }
}